

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O0

bool __thiscall kwssys::Glob::FindFiles(Glob *this,string *inexpr,GlobMessages *messages)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string *in_RSI;
  int ch;
  size_type last_slash;
  size_type skip;
  string fexpr;
  string expr;
  size_type cc;
  string cexpr;
  string *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string *in_stack_fffffffffffffe78;
  Glob *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  allocator local_149;
  string local_148 [32];
  string local_128 [32];
  string local_108 [36];
  int local_e4;
  ulong local_e0;
  ulong local_d8;
  string local_d0 [32];
  string local_b0 [8];
  GlobMessages *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  Glob *in_stack_ffffffffffffff70;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string local_38 [40];
  string *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_60,local_10);
  std::vector<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>::clear
            ((vector<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_> *)
             0x1c3381);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x1c338e);
  bVar1 = SystemTools::FileIsFullPath(in_stack_fffffffffffffe40);
  if (!bVar1) {
    SystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    std::__cxx11::string::operator=(local_60,(string *)&stack0xffffffffffffff70);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::operator+(in_stack_fffffffffffffe88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe80);
    std::__cxx11::string::operator+=(local_60,local_b0);
    std::__cxx11::string::~string(local_b0);
  }
  std::__cxx11::string::string(local_d0,local_60);
  local_d8 = 0;
  local_e0 = 0;
  for (local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pbVar5 = local_40, uVar2 = std::__cxx11::string::size(), pbVar5 < uVar2;
      local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)local_40 + 1)) {
    if (((local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_60), *pcVar3 == '/')) &&
       (in_stack_fffffffffffffe80 = (Glob *)std::__cxx11::string::operator[]((ulong)local_60),
       *(_Alloc_hider *)&in_stack_fffffffffffffe80->Internals != (_Alloc_hider)0x5c)) {
      local_e0 = (ulong)local_40;
    }
    if ((local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
       ((((in_stack_fffffffffffffe78 = (string *)std::__cxx11::string::operator[]((ulong)local_60),
          in_stack_fffffffffffffe78->_M_dataplus == (_Alloc_hider)0x5b ||
          (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_60), *pcVar3 == '?')) ||
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_60), *pcVar3 == '*')) &&
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_60), *pcVar3 != '\\'))))
    break;
  }
  if (local_e0 != 0) {
    local_d8 = local_e0;
  }
  if (((local_d8 == 0) &&
      (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_60), *pcVar3 == ':')) &&
     (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_60), *pcVar3 != '/')) {
    local_d8 = 2;
  }
  if (local_d8 != 0) {
    std::__cxx11::string::erase((ulong)local_60,0);
  }
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while (pbVar5 = local_40,
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::size(), pbVar5 < pbVar4) {
    in_stack_fffffffffffffe40 = (string *)std::__cxx11::string::operator[]((ulong)local_60);
    local_e4 = (int)(char)in_stack_fffffffffffffe40->_M_dataplus;
    if (local_e4 == 0x2f) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        AddExpression(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      }
      std::__cxx11::string::operator=(local_38,"");
    }
    else {
      std::__cxx11::string::append((ulong)local_38,'\x01');
    }
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_40->field_0x1;
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    AddExpression(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  }
  if (local_d8 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"/",&local_149);
    ProcessDirectory(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff58);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
  }
  else {
    std::__cxx11::string::substr((ulong)local_128,(ulong)local_d0);
    std::operator+(pbVar5,(char *)in_stack_fffffffffffffe40);
    ProcessDirectory(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff58);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_128);
  }
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_38);
  return true;
}

Assistant:

bool Glob::FindFiles(const std::string& inexpr, GlobMessages* messages)
{
  std::string cexpr;
  std::string::size_type cc;
  std::string expr = inexpr;

  this->Internals->Expressions.clear();
  this->Internals->Files.clear();

  if (!kwsys::SystemTools::FileIsFullPath(expr)) {
    expr = kwsys::SystemTools::GetCurrentWorkingDirectory();
    expr += "/" + inexpr;
  }
  std::string fexpr = expr;

  std::string::size_type skip = 0;
  std::string::size_type last_slash = 0;
  for (cc = 0; cc < expr.size(); cc++) {
    if (cc > 0 && expr[cc] == '/' && expr[cc - 1] != '\\') {
      last_slash = cc;
    }
    if (cc > 0 && (expr[cc] == '[' || expr[cc] == '?' || expr[cc] == '*') &&
        expr[cc - 1] != '\\') {
      break;
    }
  }
  if (last_slash > 0) {
    // std::cout << "I can skip: " << fexpr.substr(0, last_slash)
    // << std::endl;
    skip = last_slash;
  }
  if (skip == 0) {
#if defined(KWSYS_GLOB_SUPPORT_NETWORK_PATHS)
    // Handle network paths
    if (expr[0] == '/' && expr[1] == '/') {
      int cnt = 0;
      for (cc = 2; cc < expr.size(); cc++) {
        if (expr[cc] == '/') {
          cnt++;
          if (cnt == 2) {
            break;
          }
        }
      }
      skip = int(cc + 1);
    } else
#endif
      // Handle drive letters on Windows
      if (expr[1] == ':' && expr[0] != '/') {
        skip = 2;
      }
  }

  if (skip > 0) {
    expr.erase(0, skip);
  }

  for (cc = 0; cc < expr.size(); cc++) {
    int ch = expr[cc];
    if (ch == '/') {
      if (!cexpr.empty()) {
        this->AddExpression(cexpr);
      }
      cexpr = "";
    } else {
      cexpr.append(1, static_cast<char>(ch));
    }
  }
  if (!cexpr.empty()) {
    this->AddExpression(cexpr);
  }

  // Handle network paths
  if (skip > 0) {
    this->ProcessDirectory(0, fexpr.substr(0, skip) + "/", messages);
  } else {
    this->ProcessDirectory(0, "/", messages);
  }
  return true;
}